

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (this->right_->fadexpr_).left_;
  pFVar4 = (this->right_->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  dVar1 = (pFVar3->fadexpr_).left_.constant_;
  return ((pFVar5->dx_).ptr_to_data[i] * dVar1 * pFVar4->val_ +
         dVar1 * pFVar5->val_ * (pFVar4->dx_).ptr_to_data[i]) -
         (((pFVar2->fadexpr_).right_)->dx_).ptr_to_data[i] * (pFVar2->fadexpr_).left_.constant_;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}